

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaValidatorPushElem(xmlSchemaValidCtxtPtr vctxt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  xmlSchemaNodeInfoPtr *ppxVar4;
  xmlSchemaNodeInfoPtr __s;
  char *message;
  uint uVar5;
  ulong uVar6;
  xmlChar *in_R8;
  ulong uVar7;
  
  iVar1 = vctxt->depth;
  uVar2 = vctxt->sizeElemInfos;
  uVar7 = (ulong)(int)uVar2;
  if ((int)uVar2 < iVar1) {
    message = "inconsistent depth encountered";
LAB_001a77d4:
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaGetFreshElemInfo",message,(xmlChar *)0x0,
               in_R8);
    goto LAB_001a7918;
  }
  if (iVar1 < (int)uVar2) {
    __s = vctxt->elemInfos[iVar1];
    if (__s != (xmlSchemaNodeInfoPtr)0x0) {
      if (__s->localName == (xmlChar *)0x0) goto LAB_001a78c0;
      message = "elem info has not been cleared";
      goto LAB_001a77d4;
    }
LAB_001a7898:
    __s = (xmlSchemaNodeInfoPtr)(*xmlMalloc)(0x90);
    if (__s != (xmlSchemaNodeInfoPtr)0x0) {
      vctxt->elemInfos[vctxt->depth] = __s;
LAB_001a78c0:
      memset(__s,0,0x90);
      __s->nodeType = 1;
      __s->depth = vctxt->depth;
      vctxt->inode = __s;
      vctxt->nbAttrInfos = 0;
      return 0;
    }
  }
  else if ((int)uVar2 < 1) {
    uVar6 = 10;
LAB_001a784b:
    ppxVar4 = (xmlSchemaNodeInfoPtr *)(*xmlRealloc)(vctxt->elemInfos,uVar6 * 8);
    if (ppxVar4 != (xmlSchemaNodeInfoPtr *)0x0) {
      vctxt->elemInfos = ppxVar4;
      vctxt->sizeElemInfos = (int)uVar6;
      if ((int)uVar2 < (int)uVar6) {
        do {
          vctxt->elemInfos[uVar7] = (xmlSchemaNodeInfoPtr)0x0;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      goto LAB_001a7898;
    }
  }
  else if (uVar2 < 1000000000) {
    uVar5 = uVar2 + 1 >> 1;
    uVar3 = uVar5 + uVar2;
    if (1000000000 - uVar5 < uVar2) {
      uVar3 = 1000000000;
    }
    uVar6 = (ulong)uVar3;
    goto LAB_001a784b;
  }
  vctxt->nberrors = vctxt->nberrors + 1;
  vctxt->err = 2;
  in_R8 = (xmlChar *)0x0;
  xmlRaiseMemoryError(vctxt->serror,vctxt->error,vctxt->errCtxt,0x11,(xmlError *)0x0);
LAB_001a7918:
  vctxt->inode = (xmlSchemaNodeInfoPtr)0x0;
  xmlSchemaInternalErr2
            ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidatorPushElem",
             "calling xmlSchemaGetFreshElemInfo()",(xmlChar *)0x0,in_R8);
  return -1;
}

Assistant:

static int
xmlSchemaValidatorPushElem(xmlSchemaValidCtxtPtr vctxt)
{
    vctxt->inode = xmlSchemaGetFreshElemInfo(vctxt);
    if (vctxt->inode == NULL) {
	VERROR_INT("xmlSchemaValidatorPushElem",
	    "calling xmlSchemaGetFreshElemInfo()");
	return (-1);
    }
    vctxt->nbAttrInfos = 0;
    return (0);
}